

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVaction INT_REVassoc_multi_action(CMConnection conn,EVstone stone,char *action_spec)

{
  int iVar1;
  CMFormat p_Var2;
  CManager in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  EVassoc_multi_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffb8;
  CMConnection in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  EVaction in_stack_ffffffffffffffd4;
  int condition;
  CManager cm;
  
  memset(&stack0xffffffffffffffc0,0,0x10);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8);
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EVassoc_multi_action_req_formats);
  condition = iVar1;
  cm = in_RDX;
  if (p_Var2 == (CMFormat)0x0) {
    INT_CMregister_format(in_RDX,(FMStructDescList)CONCAT44(in_ESI,iVar1));
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)in_RDX >> 0x20),(void *)CONCAT44(in_ESI,iVar1));
  INT_CMwrite((CMConnection)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffb8,(void *)0x154d17);
  INT_CMCondition_wait(cm,condition);
  return in_stack_ffffffffffffffd4;
}

Assistant:

extern EVaction
INT_REVassoc_multi_action(CMConnection conn, EVstone stone, char *action_spec)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_multi_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_multi_action_req_formats);
    request.stone = stone;
    request.action_spec = action_spec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_multi_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}